

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Prog * re2::Compiler::Compile(Regexp *re,bool reversed,int64_t max_mem)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ParseFlags PVar4;
  Frag a;
  Frag FVar5;
  Frag this;
  byte in_SIL;
  Regexp *in_RDI;
  Frag all;
  bool is_anchor_end;
  bool is_anchor_start;
  Regexp *sre;
  Compiler c;
  Prog *in_stack_fffffffffffffe90;
  Frag in_stack_fffffffffffffe98;
  Walker<re2::Frag> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  Compiler *in_stack_fffffffffffffeb0;
  Compiler *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffee0;
  Regexp *in_stack_fffffffffffffef8;
  Frag local_e8;
  uint32_t local_e0;
  PatchList depth;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  undefined4 in_stack_ffffffffffffff2c;
  Prog *local_a0;
  byte local_98;
  Prog *local_8;
  
  Compiler(in_stack_fffffffffffffec0);
  PVar4 = Regexp::parse_flags(in_RDI);
  Setup(in_stack_fffffffffffffeb0,
        CONCAT13(in_stack_fffffffffffffeaf,
                 CONCAT12(in_stack_fffffffffffffeae,in_stack_fffffffffffffeac)),
        (int64_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98.end.p.p);
  a = (Frag)Regexp::Simplify(in_stack_fffffffffffffef8);
  if (a == (Frag)0x0) {
    local_8 = (Prog *)0x0;
  }
  else {
    bVar1 = IsAnchorStart((Regexp **)
                          CONCAT44(in_stack_ffffffffffffff2c,
                                   CONCAT13(in_stack_ffffffffffffff2b,
                                            CONCAT12(in_stack_ffffffffffffff2a,
                                                     in_stack_ffffffffffffff28))),depth.p);
    bVar2 = IsAnchorEnd((Regexp **)
                        CONCAT44(in_stack_ffffffffffffff2c,
                                 CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff2a,
                                                         in_stack_ffffffffffffff28))),depth.p);
    Frag::Frag(&local_e8);
    FVar5.end.p._0_2_ = in_stack_fffffffffffffeac;
    FVar5.begin = in_stack_fffffffffffffea8;
    FVar5.end.p._2_1_ = in_stack_fffffffffffffeae;
    FVar5.end.p._3_1_ = in_stack_fffffffffffffeaf;
    FVar5 = Regexp::Walker<re2::Frag>::WalkExponential
                      (in_stack_fffffffffffffea0,(Regexp *)in_stack_fffffffffffffe98,FVar5,
                       (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    _local_e0 = FVar5;
    Regexp::Decref((Regexp *)CONCAT44(PVar4,in_stack_fffffffffffffee0));
    if ((local_98 & 1) == 0) {
      this = Match((Compiler *)in_stack_fffffffffffffe98,
                   (int32_t)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      _local_e0 = Cat((Compiler *)this,a,FVar5);
      Prog::set_reversed(local_a0,(bool)(in_SIL & 1));
      bVar3 = Prog::reversed(local_a0);
      if (bVar3) {
        Prog::set_anchor_start(local_a0,(bool)(bVar2 & 1));
        Prog::set_anchor_end(local_a0,(bool)(bVar1 & 1));
      }
      else {
        Prog::set_anchor_start(local_a0,(bool)(bVar1 & 1));
        Prog::set_anchor_end(local_a0,(bool)(bVar2 & 1));
      }
      Prog::set_start(local_a0,local_e0);
      bVar3 = Prog::anchor_start(local_a0);
      if (!bVar3) {
        DotStar((Compiler *)in_stack_fffffffffffffe98);
        in_stack_fffffffffffffe98 = Cat((Compiler *)this,a,FVar5);
        _local_e0 = in_stack_fffffffffffffe98;
      }
      Prog::set_start_unanchored(local_a0,local_e0);
      in_stack_fffffffffffffe90 = Finish((Compiler *)in_stack_fffffffffffffe98);
      local_8 = in_stack_fffffffffffffe90;
    }
    else {
      local_8 = (Prog *)0x0;
    }
  }
  ~Compiler((Compiler *)in_stack_fffffffffffffe90);
  return local_8;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, RE2::UNANCHORED /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  all = c.Cat(all, c.Match(0));

  c.prog_->set_reversed(reversed);
  if (c.prog_->reversed()) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  c.prog_->set_start(all.begin);
  if (!c.prog_->anchor_start()) {
    // Also create unanchored version, which starts with a .*? loop.
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start_unanchored(all.begin);

  // Hand ownership of prog_ to caller.
  return c.Finish();
}